

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int tcache_destroy_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                      size_t newlen)

{
  int iVar1;
  
  if (oldp != (void *)0x0 || oldlenp != (size_t *)0x0) {
    return 1;
  }
  if (newlen == 4 && newp != (void *)0x0) {
    duckdb_je_tcaches_destroy(tsd,*newp);
    iVar1 = 0;
  }
  else {
    iVar1 = 0x16;
  }
  return iVar1;
}

Assistant:

static int
tcache_destroy_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned tcache_ind;

	WRITEONLY();
	ASSURED_WRITE(tcache_ind, unsigned);
	tcaches_destroy(tsd, tcache_ind);

	ret = 0;
label_return:
	return ret;
}